

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t value;
  size_t slotIndex_00;
  size_t slotIndex;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_bdb3c092 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_astTupleSlotNamedAtPutNode_t **node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  slotIndex = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&slotIndex);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  value = sysbvm_interpreter_evaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
  slotIndex_00 = sysbvm_typeSlot_getIndex(*(sysbvm_tuple_t *)(*arguments + 0x40));
  sysbvm_tuple_slotAtPut(context,(sysbvm_tuple_t)gcFrameRecord.roots,slotIndex_00,value);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&slotIndex);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return value;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtPutNode_t **node = (sysbvm_astTupleSlotNamedAtPutNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->valueExpression, *environment);
    size_t slotIndex = sysbvm_typeSlot_getIndex((*node)->boundSlot);
    sysbvm_tuple_slotAtPut(context, gcFrame.tuple, slotIndex, gcFrame.value);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.value;
}